

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

string * escapeString(string *__return_storage_ptr__,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string result;
  string *text_local;
  
  result.field_2._8_8_ = text;
  std::__cxx11::string::string((string *)local_38,(string *)text);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"\\\\",&local_59);
  replaceAll((string *)local_38,"\\",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\\\"",&local_91);
  replaceAll((string *)local_38,"\"",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  tinyformat::format<std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)0x22ced8,(char *)result.field_2._8_8_,in_RCX);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string escapeString(const std::string& text)
{
	std::string result = text;
	replaceAll(result,R"(\)",R"(\\)");
	replaceAll(result,R"(")",R"(\")");

	return tfm::format(R"("%s")",text);
}